

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_by_name.hpp
# Opt level: O2

void __thiscall
duckdb::UnionByReaderTask<duckdb::ParquetMultiFileInfo,_duckdb::ParquetOptions>::~UnionByReaderTask
          (UnionByReaderTask<duckdb::ParquetMultiFileInfo,_duckdb::ParquetOptions> *this)

{
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_BaseExecutorTask).super_Task.super_enable_shared_from_this<duckdb::Task>.
              __weak_this_.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  operator_delete(this);
  return;
}

Assistant:

UnionByReaderTask(TaskExecutor &executor, ClientContext &context, const OpenFileInfo &file, idx_t file_idx,
	                  vector<shared_ptr<BaseUnionData>> &readers, OPTIONS_TYPE &options, MultiFileOptions &file_options)
	    : BaseExecutorTask(executor), context(context), file(file), file_idx(file_idx), readers(readers),
	      options(options), file_options(file_options) {
	}